

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::propagateFrom(Solver *this,PostPropagator *p)

{
  PostPropagator *pPVar1;
  PostPropagator **ppPVar2;
  bool bVar3;
  PostPropagator **start;
  
  ppPVar2 = this->postHead_;
  do {
    start = ppPVar2;
    pPVar1 = *start;
    if (pPVar1 == (PostPropagator *)0x0) {
      return true;
    }
    ppPVar2 = &pPVar1->next;
  } while (pPVar1 != p);
  bVar3 = postPropagate(this,start,(PostPropagator *)0x0);
  if (!bVar3) {
    cancelPropagation(this);
  }
  return bVar3;
}

Assistant:

bool Solver::propagateFrom(PostPropagator* p) {
	assert((p && *postHead_) && "OP not allowed during init!");
	assert(queueSize() == 0);
	for (PostPropagator** r = postHead_; *r;) {
		if      (*r != p)             { r = &(*r)->next; }
		else if (postPropagate(r, 0)) { break; }
		else {
			cancelPropagation();
			return false;
		}
	}
	assert(queueSize() == 0);
	return true;
}